

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O0

CImgList<unsigned_char> * __thiscall
cimg_library::CImgList<unsigned_char>::load_parrec(CImgList<unsigned_char> *this,char *filename)

{
  bool bVar1;
  int iVar2;
  CImgArgumentException *this_00;
  char *pcVar3;
  CImg<unsigned_int> *pCVar4;
  uint *puVar5;
  CImg<float> *pCVar6;
  float *pfVar7;
  byte *pbVar8;
  unsigned_short *puVar9;
  CImg<unsigned_char> *pCVar10;
  uchar *puVar11;
  CImgIOException *pCVar12;
  char *in_RSI;
  CImgList<unsigned_char> *in_RDI;
  float fVar13;
  float fVar14;
  int x_2;
  int y_2;
  CImg<unsigned_char> *img_2;
  CImg<unsigned_int> buf_2;
  int x_1;
  int y_1;
  CImg<unsigned_char> *img_1;
  CImg<unsigned_short> buf_1;
  int x;
  int y;
  CImg<unsigned_char> *img;
  CImg<unsigned_char> buf;
  float ss_1;
  float rs_1;
  float ri_1;
  uint imn;
  uint sizey_1;
  uint sizex_1;
  uint pixsize_1;
  uint sn_1;
  CImg<float> *vec_2;
  int l_1;
  CImg<unsigned_int> *vec_1;
  int l;
  FILE *file2;
  CImg<unsigned_int> *vec;
  uint i;
  float ss;
  float ri;
  float rs;
  uint pixsize;
  uint sizey;
  uint sizex;
  uint sn;
  char line [256];
  int err;
  CImgList<unsigned_int> st_global;
  CImgList<float> st_slices;
  FILE *file;
  char *ext;
  char filenamerec [1024];
  char filenamepar [1024];
  char body [1024];
  undefined1 *puVar15;
  undefined4 uVar16;
  CImg<float> *this_01;
  CImgList<float> *list;
  CImg<float> *in_stack_fffffffffffff020;
  float *in_stack_fffffffffffff028;
  CImgList<float> *in_stack_fffffffffffff030;
  CImgIOException *pCVar17;
  undefined4 in_stack_fffffffffffff038;
  uint uVar18;
  undefined4 in_stack_fffffffffffff03c;
  uint uVar19;
  float *in_stack_fffffffffffff040;
  float *in_stack_fffffffffffff048;
  FILE *in_stack_fffffffffffff060;
  undefined4 in_stack_fffffffffffff068;
  uint in_stack_fffffffffffff06c;
  float *in_stack_fffffffffffff070;
  uint in_stack_fffffffffffff0a8;
  float in_stack_fffffffffffff0ac;
  float *in_stack_fffffffffffff0b0;
  undefined4 in_stack_fffffffffffff0b8;
  uint in_stack_fffffffffffff0bc;
  bool local_f0e;
  uint local_ee0;
  uint local_edc;
  uint *local_eb8;
  uint local_eb0;
  uint local_eac;
  CImg<unsigned_short> local_ea0;
  uint local_e80;
  uint local_e7c;
  CImg<unsigned_char> *local_e78;
  CImg<unsigned_char> local_e70;
  float local_e50;
  float local_e4c;
  float local_e48;
  uint local_e44;
  int local_e40;
  int local_e3c;
  int local_e38;
  uint local_e34;
  CImg<float> *local_e30;
  int local_e24;
  CImg<unsigned_int> *local_e00;
  int local_df4;
  FILE *local_df0;
  CImg<unsigned_int> *local_de8;
  uint local_dc0;
  undefined1 local_dbc [12];
  float local_db0;
  float local_dac;
  undefined1 local_d84 [12];
  uint local_d78;
  uint local_d74;
  uint local_d70;
  uint local_d6c;
  char local_d68 [268];
  int local_c5c;
  CImgList<unsigned_int> local_c58;
  CImgList<float> local_c48;
  FILE *local_c38;
  char *local_c30;
  char local_c28 [1024];
  char local_828 [1024];
  undefined1 local_428 [1048];
  char *local_10;
  
  if (in_RSI == (char *)0x0) {
    this_00 = (CImgArgumentException *)__cxa_allocate_exception(0x4008);
    uVar18 = in_RDI->_width;
    uVar19 = in_RDI->_allocated_width;
    pCVar10 = in_RDI->_data;
    pcVar3 = pixel_type();
    CImgArgumentException::CImgArgumentException
              (this_00,
               "[instance(%u,%u,%p)] CImgList<%s>::load_parrec() : Specified filename is (null).",
               (ulong)uVar18,(ulong)uVar19,pCVar10,pcVar3);
    __cxa_throw(this_00,&CImgArgumentException::typeinfo,
                CImgArgumentException::~CImgArgumentException);
  }
  local_10 = in_RSI;
  memset(local_428,0,0x400);
  memset(local_828,0,0x400);
  memset(local_c28,0,0x400);
  local_c30 = cimg::split_filename
                        ((char *)in_stack_fffffffffffff028,(char *)in_stack_fffffffffffff020);
  iVar2 = strcmp(local_c30,"par");
  if (iVar2 == 0) {
    strncpy(local_828,local_10,0x3ff);
    snprintf(local_c28,0x400,"%s.rec",local_428);
  }
  iVar2 = strcmp(local_c30,"PAR");
  if (iVar2 == 0) {
    strncpy(local_828,local_10,0x3ff);
    snprintf(local_c28,0x400,"%s.REC",local_428);
  }
  iVar2 = strcmp(local_c30,"rec");
  if (iVar2 == 0) {
    strncpy(local_c28,local_10,0x3ff);
    snprintf(local_828,0x400,"%s.par",local_428);
  }
  iVar2 = strcmp(local_c30,"REC");
  if (iVar2 == 0) {
    strncpy(local_c28,local_10,0x3ff);
    snprintf(local_828,0x400,"%s.PAR",local_428);
  }
  local_c38 = cimg::fopen(local_828,"r");
  CImgList<float>::CImgList(&local_c48);
  CImgList<unsigned_int>::CImgList(&local_c58);
  memset(local_d68,0,0x100);
  do {
    local_c5c = __isoc99_fscanf(local_c38,"%255[^\n]%*c",local_d68);
    local_f0e = false;
    if (local_c5c != -1) {
      local_f0e = local_d68[0] == '#' || local_d68[0] == '.';
    }
  } while (local_f0e);
  do {
    list = (CImgList<float> *)local_d84;
    this_01 = (CImg<float> *)(local_d84 + 8);
    puVar15 = local_d84 + 4;
    local_c5c = __isoc99_fscanf(local_c38,"%u%*u%*u%*u%*u%*u%*u%u%*u%u%u%g%g%g%*[^\n]",&local_d6c,
                                &local_d78,&local_d70,&local_d74,puVar15);
    if (local_c5c == 7) {
      local_dac = (float)local_d6c;
      local_db0 = (float)local_d78;
      local_dbc._8_4_ = (undefined4)local_d70;
      local_dbc._4_4_ = (undefined4)local_d74;
      local_dbc._0_4_ = 0;
      list = (CImgList<float> *)local_dbc;
      this_01 = (CImg<float> *)local_d84;
      puVar15 = local_d84 + 8;
      CImg<float>::vector(in_stack_fffffffffffff048,in_stack_fffffffffffff040,
                          (float *)CONCAT44(in_stack_fffffffffffff03c,in_stack_fffffffffffff038),
                          (float *)in_stack_fffffffffffff030,in_stack_fffffffffffff028,
                          (float *)in_stack_fffffffffffff060,
                          (float *)CONCAT44(in_stack_fffffffffffff06c,in_stack_fffffffffffff068),
                          in_stack_fffffffffffff070);
      CImg<float>::move_to<float>(in_stack_fffffffffffff020,list,(uint)((ulong)this_01 >> 0x20));
      CImg<float>::~CImg(this_01);
      local_dc0 = 0;
      while( true ) {
        uVar18 = local_d6c;
        bVar1 = false;
        if (local_dc0 < local_c58._width) {
          pCVar4 = cimg_library::CImgList::operator_cast_to_CImg_((CImgList *)&local_c58);
          puVar5 = cimg_library::CImg::operator_cast_to_unsigned_int_((CImg *)(pCVar4 + local_dc0));
          bVar1 = uVar18 <= puVar5[2];
        }
        if (!bVar1) break;
        local_dc0 = local_dc0 + 1;
      }
      if (local_dc0 == local_c58._width) {
        CImg<unsigned_int>::vector
                  ((uint *)CONCAT44(in_stack_fffffffffffff03c,in_stack_fffffffffffff038),
                   &in_stack_fffffffffffff030->_width,(uint *)in_stack_fffffffffffff028);
        CImg<unsigned_int>::move_to<unsigned_int>
                  ((CImg<unsigned_int> *)in_stack_fffffffffffff020,(CImgList<unsigned_int> *)list,
                   (uint)((ulong)this_01 >> 0x20));
        CImg<unsigned_int>::~CImg((CImg<unsigned_int> *)this_01);
      }
      else {
        local_de8 = cimg_library::CImgList::operator_cast_to_CImg_((CImgList *)&local_c58);
        uVar18 = local_d70;
        local_de8 = local_de8 + local_dc0;
        puVar5 = cimg_library::CImg::operator_cast_to_unsigned_int_((CImg *)local_de8);
        uVar19 = local_d70;
        if (*puVar5 < uVar18) {
          puVar5 = cimg_library::CImg::operator_cast_to_unsigned_int_((CImg *)local_de8);
          *puVar5 = uVar19;
        }
        uVar18 = local_d74;
        puVar5 = cimg_library::CImg::operator_cast_to_unsigned_int_((CImg *)local_de8);
        uVar19 = local_d74;
        if (puVar5[1] < uVar18) {
          puVar5 = cimg_library::CImg::operator_cast_to_unsigned_int_((CImg *)local_de8);
          puVar5[1] = uVar19;
        }
        in_stack_fffffffffffff0bc = local_d6c;
        puVar5 = cimg_library::CImg::operator_cast_to_unsigned_int_((CImg *)local_de8);
        puVar5[2] = in_stack_fffffffffffff0bc;
      }
      in_stack_fffffffffffff0ac = (float)local_dc0;
      pCVar6 = cimg_library::CImgList::operator_cast_to_CImg_((CImgList *)&local_c48);
      in_stack_fffffffffffff0b0 =
           cimg_library::CImg::operator_cast_to_float_((CImg *)(pCVar6 + (local_c48._width - 1)));
      in_stack_fffffffffffff0b0[7] = in_stack_fffffffffffff0ac;
    }
  } while (local_c5c == 7);
  local_df0 = cimg::fopen(local_c28,"rb");
  for (local_df4 = 0; local_df4 < (int)local_c58._width; local_df4 = local_df4 + 1) {
    local_e00 = cimg_library::CImgList::operator_cast_to_CImg_((CImgList *)&local_c58);
    local_e00 = local_e00 + local_df4;
    cimg_library::CImg::operator_cast_to_unsigned_int_((CImg *)local_e00);
    cimg_library::CImg::operator_cast_to_unsigned_int_((CImg *)local_e00);
    cimg_library::CImg::operator_cast_to_unsigned_int_((CImg *)local_e00);
    CImg<unsigned_char>::CImg
              ((CImg<unsigned_char> *)CONCAT44(in_stack_fffffffffffff0bc,in_stack_fffffffffffff0b8),
               (uint)((ulong)in_stack_fffffffffffff0b0 >> 0x20),(uint)in_stack_fffffffffffff0b0,
               (uint)in_stack_fffffffffffff0ac,in_stack_fffffffffffff0a8);
    CImg<unsigned_char>::move_to<unsigned_char>
              ((CImg<unsigned_char> *)in_stack_fffffffffffff020,(CImgList<unsigned_char> *)list,
               (uint)((ulong)this_01 >> 0x20));
    CImg<unsigned_char>::~CImg((CImg<unsigned_char> *)this_01);
  }
  local_e24 = 0;
  do {
    if ((int)local_c48._width <= local_e24) {
      cimg::fclose(local_c38);
      cimg::fclose(local_df0);
      if (in_RDI->_width == 0) {
        pCVar12 = (CImgIOException *)__cxa_allocate_exception(0x4008);
        uVar18 = in_RDI->_width;
        uVar19 = in_RDI->_allocated_width;
        pCVar10 = in_RDI->_data;
        pCVar17 = pCVar12;
        pcVar3 = pixel_type();
        CImgIOException::CImgIOException
                  (pCVar17,
                   "[instance(%u,%u,%p)] CImgList<%s>::load_parrec() : Failed to recognize valid PAR-REC data in file \'%s\'."
                   ,(ulong)uVar18,(ulong)uVar19,pCVar10,pcVar3,local_10);
        __cxa_throw(pCVar12,&CImgIOException::typeinfo,CImgIOException::~CImgIOException);
      }
      CImgList<unsigned_int>::~CImgList((CImgList<unsigned_int> *)in_stack_fffffffffffff030);
      CImgList<float>::~CImgList(in_stack_fffffffffffff030);
      return in_RDI;
    }
    local_e30 = cimg_library::CImgList::operator_cast_to_CImg_((CImgList *)&local_c48);
    local_e30 = local_e30 + local_e24;
    pfVar7 = cimg_library::CImg::operator_cast_to_float_((CImg *)local_e30);
    local_e34 = (int)(long)*pfVar7 - 1;
    pfVar7 = cimg_library::CImg::operator_cast_to_float_((CImg *)local_e30);
    local_e38 = (int)(long)pfVar7[1];
    pfVar7 = cimg_library::CImg::operator_cast_to_float_((CImg *)local_e30);
    local_e3c = (int)(long)pfVar7[2];
    pfVar7 = cimg_library::CImg::operator_cast_to_float_((CImg *)local_e30);
    local_e40 = (int)(long)pfVar7[3];
    pfVar7 = cimg_library::CImg::operator_cast_to_float_((CImg *)local_e30);
    local_e44 = (uint)(long)pfVar7[7];
    pfVar7 = cimg_library::CImg::operator_cast_to_float_((CImg *)local_e30);
    local_e48 = pfVar7[4];
    pfVar7 = cimg_library::CImg::operator_cast_to_float_((CImg *)local_e30);
    local_e4c = pfVar7[5];
    pfVar7 = cimg_library::CImg::operator_cast_to_float_((CImg *)local_e30);
    uVar16 = (undefined4)((ulong)puVar15 >> 0x20);
    local_e50 = pfVar7[6];
    uVar18 = (uint)in_stack_fffffffffffff0b0;
    uVar19 = (uint)((ulong)in_stack_fffffffffffff0b0 >> 0x20);
    if (local_e38 == 8) {
      CImg<unsigned_char>::CImg
                ((CImg<unsigned_char> *)
                 CONCAT44(in_stack_fffffffffffff0bc,in_stack_fffffffffffff0b8),uVar19,uVar18,
                 (uint)in_stack_fffffffffffff0ac,in_stack_fffffffffffff0a8);
      cimg::fread<unsigned_char>
                ((uchar *)in_stack_fffffffffffff070,in_stack_fffffffffffff06c,
                 in_stack_fffffffffffff060);
      bVar1 = cimg::endianness();
      if (bVar1) {
        cimg::invert_endianness<unsigned_char>(local_e70._data,local_e3c * local_e40);
      }
      local_e78 = cimg_library::CImgList::operator_cast_to_CImg_((CImgList *)in_RDI);
      local_e78 = local_e78 + local_e44;
      for (local_e7c = 0; (int)local_e7c < (int)local_e78->_height; local_e7c = local_e7c + 1) {
        for (local_e80 = 0; (int)local_e80 < (int)local_e78->_width; local_e80 = local_e80 + 1) {
          pbVar8 = CImg<unsigned_char>::operator()(&local_e70,local_e80,local_e7c);
          fVar13 = (float)*pbVar8 * local_e4c + local_e48;
          fVar14 = local_e4c * local_e50;
          puVar11 = CImg<unsigned_char>::operator()(local_e78,local_e80,local_e7c,local_e34);
          *puVar11 = (uchar)(int)(fVar13 / fVar14);
        }
      }
      CImg<unsigned_char>::~CImg((CImg<unsigned_char> *)this_01);
    }
    else if (local_e38 == 0x10) {
      CImg<unsigned_short>::CImg
                ((CImg<unsigned_short> *)
                 CONCAT44(in_stack_fffffffffffff0bc,in_stack_fffffffffffff0b8),uVar19,uVar18,
                 (uint)in_stack_fffffffffffff0ac,in_stack_fffffffffffff0a8);
      cimg::fread<unsigned_short>
                ((unsigned_short *)in_stack_fffffffffffff070,in_stack_fffffffffffff06c,
                 in_stack_fffffffffffff060);
      bVar1 = cimg::endianness();
      if (bVar1) {
        cimg::invert_endianness<unsigned_short>(local_ea0._data,local_e3c * local_e40);
      }
      pCVar10 = cimg_library::CImgList::operator_cast_to_CImg_((CImgList *)in_RDI);
      pCVar10 = pCVar10 + local_e44;
      for (local_eac = 0; (int)local_eac < (int)pCVar10->_height; local_eac = local_eac + 1) {
        for (local_eb0 = 0; (int)local_eb0 < (int)pCVar10->_width; local_eb0 = local_eb0 + 1) {
          puVar9 = CImg<unsigned_short>::operator()(&local_ea0,local_eb0,local_eac);
          fVar13 = (float)*puVar9 * local_e4c + local_e48;
          fVar14 = local_e4c * local_e50;
          puVar11 = CImg<unsigned_char>::operator()(pCVar10,local_eb0,local_eac,local_e34);
          *puVar11 = (uchar)(int)(fVar13 / fVar14);
        }
      }
      CImg<unsigned_short>::~CImg((CImg<unsigned_short> *)this_01);
    }
    else {
      if (local_e38 != 0x20) {
        cimg::fclose(local_c38);
        cimg::fclose(local_df0);
        pCVar12 = (CImgIOException *)__cxa_allocate_exception(0x4008);
        uVar18 = in_RDI->_width;
        uVar19 = in_RDI->_allocated_width;
        pCVar10 = in_RDI->_data;
        pCVar17 = pCVar12;
        pcVar3 = pixel_type();
        CImgIOException::CImgIOException
                  (pCVar12,
                   "[instance(%u,%u,%p)] CImgList<%s>::load_parrec() : Unsupported %d-bits pixel type for file \'%s\'."
                   ,(ulong)uVar18,(ulong)uVar19,pCVar10,pcVar3,CONCAT44(uVar16,local_e38),local_10);
        __cxa_throw(pCVar17,&CImgIOException::typeinfo,CImgIOException::~CImgIOException);
      }
      CImg<unsigned_int>::CImg
                ((CImg<unsigned_int> *)CONCAT44(in_stack_fffffffffffff0bc,in_stack_fffffffffffff0b8)
                 ,uVar19,uVar18,(uint)in_stack_fffffffffffff0ac,in_stack_fffffffffffff0a8);
      cimg::fread<unsigned_int>
                ((uint *)in_stack_fffffffffffff070,in_stack_fffffffffffff06c,
                 in_stack_fffffffffffff060);
      bVar1 = cimg::endianness();
      if (bVar1) {
        cimg::invert_endianness<unsigned_int>(local_eb8,local_e3c * local_e40);
      }
      pCVar10 = cimg_library::CImgList::operator_cast_to_CImg_((CImgList *)in_RDI);
      pCVar10 = pCVar10 + local_e44;
      for (local_edc = 0; (int)local_edc < (int)pCVar10->_height; local_edc = local_edc + 1) {
        for (local_ee0 = 0; (int)local_ee0 < (int)pCVar10->_width; local_ee0 = local_ee0 + 1) {
          in_stack_fffffffffffff070 =
               (float *)CImg<unsigned_int>::operator()
                                  ((CImg<unsigned_int> *)&stack0xfffffffffffff130,local_ee0,
                                   local_edc);
          in_stack_fffffffffffff06c =
               CONCAT13((char)(int)(((float)(uint)*in_stack_fffffffffffff070 * local_e4c + local_e48
                                    ) / (local_e4c * local_e50)),(int3)in_stack_fffffffffffff06c);
          puVar11 = CImg<unsigned_char>::operator()(pCVar10,local_ee0,local_edc,local_e34);
          *puVar11 = (uchar)(in_stack_fffffffffffff06c >> 0x18);
        }
      }
      CImg<unsigned_int>::~CImg((CImg<unsigned_int> *)this_01);
    }
    local_e24 = local_e24 + 1;
  } while( true );
}

Assistant:

CImgList<T>& load_parrec(const char *const filename) {
      if (!filename)
        throw CImgArgumentException(_cimglist_instance
                                    "load_parrec() : Specified filename is (null).",
                                    cimglist_instance);

      char body[1024] = { 0 }, filenamepar[1024] = { 0 }, filenamerec[1024] = { 0 };
      const char *const ext = cimg::split_filename(filename,body);
      if (!std::strcmp(ext,"par")) { std::strncpy(filenamepar,filename,sizeof(filenamepar)-1); cimg_snprintf(filenamerec,sizeof(filenamerec),"%s.rec",body); }
      if (!std::strcmp(ext,"PAR")) { std::strncpy(filenamepar,filename,sizeof(filenamepar)-1); cimg_snprintf(filenamerec,sizeof(filenamerec),"%s.REC",body); }
      if (!std::strcmp(ext,"rec")) { std::strncpy(filenamerec,filename,sizeof(filenamerec)-1); cimg_snprintf(filenamepar,sizeof(filenamepar),"%s.par",body); }
      if (!std::strcmp(ext,"REC")) { std::strncpy(filenamerec,filename,sizeof(filenamerec)-1); cimg_snprintf(filenamepar,sizeof(filenamepar),"%s.PAR",body); }
      std::FILE *file = cimg::fopen(filenamepar,"r");

      // Parse header file
      CImgList<floatT> st_slices;
      CImgList<uintT> st_global;
      int err;
      char line[256] = { 0 };
      do { err=std::fscanf(file,"%255[^\n]%*c",line); } while (err!=EOF && (*line=='#' || *line=='.'));
      do {
        unsigned int sn,sizex,sizey,pixsize;
        float rs,ri,ss;
        err = std::fscanf(file,"%u%*u%*u%*u%*u%*u%*u%u%*u%u%u%g%g%g%*[^\n]",&sn,&pixsize,&sizex,&sizey,&ri,&rs,&ss);
        if (err==7) {
          CImg<floatT>::vector((float)sn,(float)pixsize,(float)sizex,(float)sizey,ri,rs,ss,0).move_to(st_slices);
          unsigned int i; for (i = 0; i<st_global._width && sn<=st_global[i][2]; ++i) {}
          if (i==st_global._width) CImg<uintT>::vector(sizex,sizey,sn).move_to(st_global);
          else {
            CImg<uintT> &vec = st_global[i];
            if (sizex>vec[0]) vec[0] = sizex;
            if (sizey>vec[1]) vec[1] = sizey;
            vec[2] = sn;
          }
          st_slices[st_slices._width-1][7] = (float)i;
        }
      } while (err==7);

      // Read data
      std::FILE *file2 = cimg::fopen(filenamerec,"rb");
      cimglist_for(st_global,l) {
        const CImg<uintT>& vec = st_global[l];
        CImg<T>(vec[0],vec[1],vec[2]).move_to(*this);
      }

      cimglist_for(st_slices,l) {
        const CImg<floatT>& vec = st_slices[l];
        const unsigned int
          sn = (unsigned int)vec[0] - 1,
          pixsize = (unsigned int)vec[1],
          sizex = (unsigned int)vec[2],
          sizey = (unsigned int)vec[3],
          imn = (unsigned int)vec[7];
        const float ri = vec[4], rs = vec[5], ss = vec[6];
        switch (pixsize) {
        case 8 : {
          CImg<ucharT> buf(sizex,sizey);
          cimg::fread(buf._data,sizex*sizey,file2);
          if (cimg::endianness()) cimg::invert_endianness(buf._data,sizex*sizey);
          CImg<T>& img = (*this)[imn];
          cimg_forXY(img,x,y) img(x,y,sn) = (T)(( buf(x,y)*rs + ri )/(rs*ss));
        } break;
        case 16 : {
          CImg<ushortT> buf(sizex,sizey);
          cimg::fread(buf._data,sizex*sizey,file2);
          if (cimg::endianness()) cimg::invert_endianness(buf._data,sizex*sizey);
          CImg<T>& img = (*this)[imn];
          cimg_forXY(img,x,y) img(x,y,sn) = (T)(( buf(x,y)*rs + ri )/(rs*ss));
        } break;
        case 32 : {
          CImg<uintT> buf(sizex,sizey);
          cimg::fread(buf._data,sizex*sizey,file2);
          if (cimg::endianness()) cimg::invert_endianness(buf._data,sizex*sizey);
          CImg<T>& img = (*this)[imn];
          cimg_forXY(img,x,y) img(x,y,sn) = (T)(( buf(x,y)*rs + ri )/(rs*ss));
        } break;
        default :
          cimg::fclose(file);
          cimg::fclose(file2);
          throw CImgIOException(_cimglist_instance
                                "load_parrec() : Unsupported %d-bits pixel type for file '%s'.",
                                cimglist_instance,
                                pixsize,filename);
        }
      }
      cimg::fclose(file);
      cimg::fclose(file2);
      if (!_width)
        throw CImgIOException(_cimglist_instance
                              "load_parrec() : Failed to recognize valid PAR-REC data in file '%s'.",
                              cimglist_instance,
                              filename);
      return *this;
    }